

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadzone.cpp
# Opt level: O0

void __thiscall NaDeadZoneFunc::NaDeadZoneFunc(NaDeadZoneFunc *this,char *szOptions,NaVector *vInit)

{
  char *in_RSI;
  NaExternFunc *in_RDI;
  double dVar1;
  NaReal fTest;
  char *szHalfWidth;
  char *szGain;
  char *szRest;
  char *local_28;
  char *local_20 [2];
  char *local_10;
  
  local_10 = in_RSI;
  NaExternFunc::NaExternFunc(in_RDI);
  *(undefined ***)in_RDI = &PTR_PrintLog_00103d30;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0x3ff0000000000000;
  dVar1 = strtod(local_10,&local_28);
  if (local_10 != local_28) {
    *(double *)(in_RDI + 0x20) = dVar1;
  }
  dVar1 = strtod(local_28,local_20);
  if (local_28 != local_20[0]) {
    *(double *)(in_RDI + 0x28) = dVar1;
  }
  return;
}

Assistant:

NaDeadZoneFunc::NaDeadZoneFunc (char* szOptions,
				NaVector& vInit)
  : fGain(1.0), fHalfWidth(0.0)
{
  char		*szRest, *szGain, *szHalfWidth = szOptions;
  NaReal	fTest;

  fTest = strtod(szHalfWidth, &szGain);
  if(szHalfWidth != szGain)
    fHalfWidth = fTest;

  fTest = strtod(szGain, &szRest);
  if(szGain != szRest)
    fGain = fTest;
}